

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

void aom_highbd_quantize_b_adaptive_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  int local_68;
  int zbins [2];
  int nzbins [2];
  int prescan_add [2];
  
  bVar2 = (byte)log_scale;
  iVar10 = (1 << (bVar2 & 0x1f)) >> 1;
  zbins[0] = *zbin_ptr + iVar10 >> (bVar2 & 0x1f);
  nzbins[0] = -zbins[0];
  zbins[1] = zbin_ptr[1] + iVar10 >> (bVar2 & 0x1f);
  nzbins[1] = -zbins[1];
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    prescan_add[lVar8] = dequant_ptr[lVar8] * 0x145 + 0x40 >> 7;
  }
  uVar9 = n_coeffs & 0xffffffff;
  while (uVar6 = uVar9, 0 < (int)uVar6) {
    sVar1 = scan[uVar6 - 1];
    uVar7 = 0x20;
    if (qm_ptr != (qm_val_t *)0x0) {
      uVar7 = (uint)qm_ptr[sVar1];
    }
    uVar9 = (ulong)((uint)(sVar1 != 0) * 4);
    iVar5 = *(int *)((long)prescan_add + uVar9);
    if ((*(int *)((long)zbins + uVar9) * 0x20 + iVar5 <= (int)(uVar7 * coeff_ptr[sVar1])) ||
       (uVar9 = uVar6 - 1, (int)(uVar7 * coeff_ptr[sVar1]) <= nzbins[sVar1 != 0] * 0x20 - iVar5))
    goto LAB_0023aac5;
  }
  uVar6 = (ulong)((int)(uint)n_coeffs >> 0x1f & (uint)n_coeffs);
LAB_0023aac5:
  uVar11 = 0;
  uVar9 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar9 = uVar11;
  }
  uVar6 = 0xffffffffffffffff;
  local_68 = -1;
  for (; iVar5 = (int)uVar6, uVar9 != uVar11; uVar11 = uVar11 + 1) {
    sVar1 = scan[uVar11];
    if (qm_ptr == (qm_val_t *)0x0) {
      bVar3 = 0x20;
    }
    else {
      bVar3 = qm_ptr[sVar1];
    }
    uVar7 = coeff_ptr[sVar1] >> 0x1f;
    iVar13 = (coeff_ptr[sVar1] ^ uVar7) - uVar7;
    bVar15 = sVar1 != 0;
    if (zbins[bVar15] * 0x20 <= (int)(iVar13 * (uint)bVar3)) {
      uVar14 = (ulong)((uint)bVar15 * 2);
      lVar8 = (ulong)bVar3 *
              (long)((*(short *)((long)round_ptr + uVar14) + iVar10 >> (bVar2 & 0x1f)) + iVar13);
      uVar12 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar14) *
                      ((*(short *)((long)quant_ptr + uVar14) * lVar8 >> 0x10) + lVar8) >>
                     (0x15 - bVar2 & 0x3f));
      qcoeff_ptr[sVar1] = (uVar7 ^ uVar12) - uVar7;
      uVar4 = 0x20;
      if (iqm_ptr != (qm_val_t *)0x0) {
        uVar4 = (uint)iqm_ptr[sVar1];
      }
      dqcoeff_ptr[sVar1] =
           ((int)(((int)((int)dequant_ptr[bVar15] * uVar4 + 0x10) >> 5) * uVar12) >> (bVar2 & 0x1f)
           ^ uVar7) - uVar7;
      if (uVar12 != 0) {
        local_68 = (int)uVar11;
        if (iVar5 == -1) {
          uVar6 = uVar11;
        }
        uVar6 = uVar6 & 0xffffffff;
      }
    }
  }
  if (iVar5 == local_68 && -1 < local_68) {
    sVar1 = scan[uVar6 & 0xffffffff];
    local_68 = iVar5;
    if ((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) {
      if (qm_ptr == (qm_val_t *)0x0) {
        uVar7 = 0x20;
      }
      else {
        uVar7 = (uint)qm_ptr[sVar1];
      }
      bVar15 = sVar1 != 0;
      iVar10 = dequant_ptr[bVar15] * 0x20d + 0x40 >> 7;
      if (((int)(uVar7 * coeff_ptr[sVar1]) < zbins[bVar15] * 0x20 + iVar10) &&
         (nzbins[bVar15] * 0x20 - iVar10 < (int)(uVar7 * coeff_ptr[sVar1]))) {
        qcoeff_ptr[sVar1] = 0;
        dqcoeff_ptr[sVar1] = 0;
        local_68 = -1;
      }
    }
  }
  *eob_ptr = (short)local_68 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  (void)iscan;
  int i, non_zero_count = (int)n_coeffs, eob = -1;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  int prescan_add[2];
  for (i = 0; i < 2; ++i)
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;
    const int prescan_add_val = prescan_add[rc != 0];
    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif  // SKIP_EOB_FACTOR_ADJUST
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      const int64_t tmp1 =
          abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
      const int64_t tmpw = tmp1 * wt;
      const int64_t tmp2 = ((tmpw * quant_ptr[rc != 0]) >> 16) + tmpw;
      const int abs_qcoeff = (int)((tmp2 * quant_shift_ptr[rc != 0]) >>
                                   (16 - log_scale + AOM_QM_BITS));
      qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
      const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
      if (abs_qcoeff) {
        eob = i;
#if SKIP_EOB_FACTOR_ADJUST
        if (first == -1) first = eob;
#endif  // SKIP_EOB_FACTOR_ADJUST
      }
    }
  }
#if SKIP_EOB_FACTOR_ADJUST
  if (eob >= 0 && first == eob) {
    const int rc = scan[eob];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const int coeff = coeff_ptr[rc] * wt;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
          coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        eob = -1;
      }
    }
  }
#endif  // SKIP_EOB_FACTOR_ADJUST
  *eob_ptr = eob + 1;
}